

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

JSON_Status json_array_add(JSON_Array *array,JSON_Value *value)

{
  JSON_Status JVar1;
  ulong uVar2;
  size_t new_capacity;
  
  uVar2 = array->count;
  if (array->capacity <= uVar2) {
    uVar2 = array->capacity * 2;
    new_capacity = 0x10;
    if (0x10 < uVar2) {
      new_capacity = uVar2;
    }
    JVar1 = json_array_resize(array,new_capacity);
    if (JVar1 != 0) {
      return -1;
    }
    uVar2 = array->count;
  }
  value->parent = array->wrapping_value;
  array->items[uVar2] = value;
  array->count = uVar2 + 1;
  return 0;
}

Assistant:

static JSON_Status json_array_add(JSON_Array *array, JSON_Value *value) {
    if (array->count >= array->capacity) {
        size_t new_capacity = MAX(array->capacity * 2, STARTING_CAPACITY);
        if (json_array_resize(array, new_capacity) != JSONSuccess) {
            return JSONFailure;
        }
    }
    value->parent = json_array_get_wrapping_value(array);
    array->items[array->count] = value;
    array->count++;
    return JSONSuccess;
}